

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

void Commands::Paperdoll(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Character *from)

{
  World *pWVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  Character *this;
  long lVar5;
  PacketBuilder reply;
  string rank_str;
  string guild_str;
  string home_str;
  undefined1 local_110 [48];
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  pWVar1 = from->world;
  pbVar2 = (arguments->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar3,pcVar3 + pbVar2->_M_string_length);
  this = World::GetCharacter(pWVar1,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (this == (Character *)0x0) {
    pWVar1 = from->world;
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"character_not_found","");
    I18N::Format<>(&local_60,&pWVar1->i18n,(string *)local_110);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_80._M_dataplus._M_p = (pointer)local_110._0_8_;
    if ((undefined1 *)local_110._0_8_ == local_110 + 0x10) {
      return;
    }
  }
  else {
    Character::HomeString_abi_cxx11_(&local_80,this);
    Character::GuildNameString_abi_cxx11_(&local_a0,this);
    Character::GuildRankString_abi_cxx11_(&local_c0,this);
    (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_e0,this);
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)local_110,PACKET_PAPERDOLL,PACKET_REPLY,
               local_c0._M_string_length +
               local_e0._M_string_length + local_80._M_string_length +
               (this->partner)._M_string_length + (this->title)._M_string_length +
               local_a0._M_string_length + 0x2a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_e0,this);
    PacketBuilder::AddBreakString((PacketBuilder *)local_110,&local_e0,0xff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    PacketBuilder::AddBreakString((PacketBuilder *)local_110,&local_80,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_110,&this->partner,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_110,&this->title,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_110,&local_a0,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_110,&local_c0,0xff);
    iVar4 = Character::PlayerID(this);
    PacketBuilder::AddShort((PacketBuilder *)local_110,iVar4);
    PacketBuilder::AddChar((PacketBuilder *)local_110,(uint)this->clas);
    PacketBuilder::AddChar((PacketBuilder *)local_110,(uint)this->gender);
    PacketBuilder::AddChar((PacketBuilder *)local_110,0);
    lVar5 = 0x2e8;
    do {
      PacketBuilder::AddShort
                ((PacketBuilder *)local_110,
                 *(int *)((long)&(this->super_Command_Source)._vptr_Command_Source + lVar5));
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x324);
    iVar4 = (*(this->super_Command_Source)._vptr_Command_Source[1])(this);
    if (((byte)iVar4 < 4) || ((this->hidden & 8) != 0)) {
      iVar4 = (*(this->super_Command_Source)._vptr_Command_Source[1])(this);
      if (((char)iVar4 == '\0') || ((this->hidden & 8) != 0)) {
        iVar4 = 6;
        if (this->party == (Party *)0x0) {
          iVar4 = 0;
        }
      }
      else {
        iVar4 = (uint)(this->party != (Party *)0x0) * 5 + 4;
      }
    }
    else {
      iVar4 = (uint)(this->party != (Party *)0x0) * 5 + 5;
    }
    PacketBuilder::AddChar((PacketBuilder *)local_110,iVar4);
    Character::Send(from,(PacketBuilder *)local_110);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_110._16_8_ = local_80.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return;
    }
  }
  operator_delete(local_80._M_dataplus._M_p,local_110._16_8_ + 1);
  return;
}

Assistant:

void Paperdoll(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		std::string home_str = victim->HomeString();
		std::string guild_str = victim->GuildNameString();
		std::string rank_str = victim->GuildRankString();

		PacketBuilder reply(PACKET_PAPERDOLL, PACKET_REPLY,
			12 + victim->SourceName().length() + home_str.length() + victim->partner.length() + victim->title.length()
			+ guild_str.length() + rank_str.length() + victim->paperdoll.size() * 2);

		reply.AddBreakString(victim->SourceName());
		reply.AddBreakString(home_str);
		reply.AddBreakString(victim->partner);
		reply.AddBreakString(victim->title);
		reply.AddBreakString(guild_str);
		reply.AddBreakString(rank_str);
		reply.AddShort(victim->PlayerID());
		reply.AddChar(victim->clas);
		reply.AddChar(victim->gender);
		reply.AddChar(0);

		UTIL_FOREACH(victim->paperdoll, item)
		{
			reply.AddShort(item);
		}

		if (victim->SourceDutyAccess() >= ADMIN_HGM && !victim->IsHideAdmin())
		{
			if (victim->party)
			{
				reply.AddChar(ICON_HGM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_HGM);
			}
		}
		else if (victim->SourceDutyAccess() >= ADMIN_GUIDE && !victim->IsHideAdmin())
		{
			if (victim->party)
			{
				reply.AddChar(ICON_GM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_GM);
			}
		}
		else
		{
			if (victim->party)
			{
				reply.AddChar(ICON_PARTY);
			}
			else
			{
				reply.AddChar(ICON_NORMAL);
			}
		}

		from->Send(reply);
	}
}